

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

void qt_message_print(QtMsgType msgType,QMessageLogContext *context,QString *message)

{
  long lVar1;
  bool bVar2;
  QLoggingCategory *pQVar3;
  code *pcVar4;
  QString *in_RDX;
  QMessageLogContext *in_RSI;
  QtMsgType in_EDI;
  long in_FS_OFFSET;
  Type msgHandler;
  QLoggingCategory *defaultCategory;
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_global_qlogging_cpp:2102:41)>
  ungrab;
  anon_class_1_0_00000001_for_m_func *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  QtMsgType in_stack_ffffffffffffffb4;
  QMessageLogContext *in_stack_ffffffffffffffb8;
  QtMsgType in_stack_ffffffffffffffc4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_EDI == QtFatalMsg) ||
       (bVar2 = isDefaultCategory((char *)CONCAT44(in_stack_ffffffffffffffb4,
                                                   in_stack_ffffffffffffffb0)), !bVar2)) ||
      (pQVar3 = QLoggingCategory::defaultCategory(), pQVar3 == (QLoggingCategory *)0x0)) ||
     (bVar2 = QLoggingCategory::isEnabled
                        ((QLoggingCategory *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4),
     bVar2)) {
    bVar2 = grabMessageHandler();
    if (bVar2) {
      qScopeGuard<qt_message_print(QtMsgType,QMessageLogContext_const&,QString_const&)::__0>
                (in_stack_ffffffffffffffa8);
      pcVar4 = QBasicAtomicPointer<void_(QtMsgType,_const_QMessageLogContext_&,_const_QString_&)>::
               loadAcquire((QBasicAtomicPointer<void_(QtMsgType,_const_QMessageLogContext_&,_const_QString_&)>
                            *)0x2473fd);
      if (pcVar4 == (Type)0x0) {
        pcVar4 = qDefaultMessageHandler;
      }
      (*pcVar4)(in_EDI,in_RSI,in_RDX);
      QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/global/qlogging.cpp:2102:41)>
      ::~QScopeGuard((QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_global_qlogging_cpp:2102:41)>
                      *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
    else {
      stderr_message_handler
                (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,
                 (QString *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_message_print(QtMsgType msgType, const QMessageLogContext &context, const QString &message)
{
    Q_TRACE(qt_message_print, msgType, context.category, context.function, context.file, context.line, message);

    // qDebug, qWarning, ... macros do not check whether category is enabledgc
    if (msgType != QtFatalMsg && isDefaultCategory(context.category)) {
        if (QLoggingCategory *defaultCategory = QLoggingCategory::defaultCategory()) {
            if (!defaultCategory->isEnabled(msgType))
                return;
        }
    }

    // prevent recursion in case the message handler generates messages
    // itself, e.g. by using Qt API
    if (grabMessageHandler()) {
        const auto ungrab = qScopeGuard([]{ ungrabMessageHandler(); });
        auto msgHandler = messageHandler.loadAcquire();
        (msgHandler ? msgHandler : qDefaultMessageHandler)(msgType, context, message);
    } else {
        stderr_message_handler(msgType, context, message);
    }
}